

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.h
# Opt level: O0

void __thiscall
chrono::ChQuaternion<double>::Q_from_AngAxis
          (ChQuaternion<double> *this,double angle,ChVector<double> *axis)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double sinhalf;
  double halfang;
  ChVector<double> *axis_local;
  double angle_local;
  ChQuaternion<double> *this_local;
  
  dVar2 = sin(angle / 2.0);
  dVar3 = cos(angle / 2.0);
  this->m_data[0] = dVar3;
  pdVar1 = ChVector<double>::x(axis);
  this->m_data[1] = *pdVar1 * dVar2;
  pdVar1 = ChVector<double>::y(axis);
  this->m_data[2] = *pdVar1 * dVar2;
  pdVar1 = ChVector<double>::z(axis);
  this->m_data[3] = *pdVar1 * dVar2;
  return;
}

Assistant:

inline void ChQuaternion<Real>::Q_from_AngAxis(Real angle, const ChVector<Real>& axis) {
    Real halfang = (angle / 2);
    Real sinhalf = sin(halfang);
    m_data[0] = cos(halfang);
    m_data[1] = axis.x() * sinhalf;
    m_data[2] = axis.y() * sinhalf;
    m_data[3] = axis.z() * sinhalf;
}